

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O2

UColAttributeValue icu_63::CollationRuleParser::getOnOffValue(UnicodeString *s)

{
  UBool UVar1;
  UColAttributeValue UVar2;
  ConstChar16Ptr local_80;
  ConstChar16Ptr local_78 [3];
  char16_t *local_60;
  UnicodeString local_50;
  
  local_78[0].p_ = L"on";
  UnicodeString::UnicodeString(&local_50,'\x01',local_78,-1);
  UVar1 = UnicodeString::operator==(s,&local_50);
  UnicodeString::~UnicodeString(&local_50);
  local_60 = local_78[0].p_;
  if (UVar1 == '\0') {
    local_80.p_ = L"off";
    UnicodeString::UnicodeString(&local_50,'\x01',&local_80,-1);
    UVar1 = UnicodeString::operator==(s,&local_50);
    UnicodeString::~UnicodeString(&local_50);
    UVar2 = -(uint)(UVar1 == '\0') | UCOL_OFF;
  }
  else {
    UVar2 = UCOL_ON;
  }
  return UVar2;
}

Assistant:

UColAttributeValue
CollationRuleParser::getOnOffValue(const UnicodeString &s) {
    if(s == UNICODE_STRING_SIMPLE("on")) {
        return UCOL_ON;
    } else if(s == UNICODE_STRING_SIMPLE("off")) {
        return UCOL_OFF;
    } else {
        return UCOL_DEFAULT;
    }
}